

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04_signalfd_epoll.c
# Opt level: O0

void handle_signals(void)

{
  ssize_t sVar1;
  int local_88 [2];
  signalfd_siginfo sfd_si;
  
  sVar1 = read(sfd,local_88,0x80);
  if (sVar1 == -1) {
    perror("read()");
    exit(1);
  }
  if (local_88[0] == 0xe) {
    printf("Got SIGALRM via SignalFD.\n");
  }
  else {
    if (local_88[0] == 3) {
      printf("Got SIGQUIT. Will exit.\n");
      exit(0);
    }
    printf("Got unexpected signal!\n");
  }
  return;
}

Assistant:

void handle_signals() {
    struct signalfd_siginfo sfd_si;
    if (read(sfd, &sfd_si, sizeof(sfd_si)) == -1)
        handle_error("read()");

    if (sfd_si.ssi_signo == SIGALRM)
        printf("Got SIGALRM via SignalFD.\n");
    else if (sfd_si.ssi_signo == SIGQUIT) {
        printf("Got SIGQUIT. Will exit.\n");
        exit(0);
    }
    else
        printf("Got unexpected signal!\n");
}